

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O1

void __thiscall QFunctionJAOHTree::DeInitialize(QFunctionJAOHTree *this)

{
  size_type sVar1;
  
  sVar1 = (this->super_QFunctionJAOH)._m_QValues.super_matrix_t.data_.size_;
  if (sVar1 != 0) {
    memset((this->super_QFunctionJAOH)._m_QValues.super_matrix_t.data_.data_,0,sVar1 << 3);
  }
  (this->super_QFunctionJAOH).field_0x38 = 0;
  return;
}

Assistant:

void QFunctionJAOHTree::DeInitialize()
{
    _m_QValues.clear();
    _m_initialized=false;
}